

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_write_dir_header(mtar_t *tar,char *name)

{
  int iVar1;
  size_t sVar2;
  mtar_header_t h;
  mtar_header_t local_100;
  
  sVar2 = strlen(name);
  iVar1 = -9;
  if (sVar2 < 100) {
    memset(&local_100,0,0xe0);
    strcpy(local_100.name,name);
    local_100.type = 0x35;
    local_100.mode = 0x1fd;
    iVar1 = mtar_write_header(tar,&local_100);
  }
  return iVar1;
}

Assistant:

int mtar_write_dir_header(mtar_t *tar, const char *name) {
  mtar_header_t h;
  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;
  /* Build header */
  memset(&h, 0, sizeof(h));
  strcpy(h.name, name);
  h.type = MTAR_TDIR;
  h.mode = 0775;
  /* Write header */
  return mtar_write_header(tar, &h);
}